

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx512_mula2(uint16_t *data,uint32_t len,uint32_t *flags)

{
  undefined1 (*pauVar1) [16];
  int j;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 in_ZMM17 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 in_ZMM18 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 in_ZMM19 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 in_ZMM20 [64];
  undefined1 auVar39 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  auVar38 = in_ZMM20._0_16_;
  auVar36 = in_ZMM19._0_16_;
  auVar34 = in_ZMM18._0_16_;
  auVar32 = in_ZMM17._0_16_;
  auVar5 = in_ZMM16._0_16_;
  pauVar1 = (undefined1 (*) [16])local_480;
  uVar4 = 0;
  memset(local_440,0,0x3c0);
  if (len < 0x40) {
    auVar22 = ZEXT1664((undefined1  [16])0x0);
  }
  else {
    auVar15 = vmovdqa64_avx512f(_DAT_00115e40);
    auVar16 = vmovdqa64_avx512f(_DAT_00115e80);
    auVar17 = vpbroadcastb_avx512bw(ZEXT116(0x11));
    auVar18 = vpbroadcastq_avx512f(ZEXT816(0xf));
    uVar2 = 2;
    auVar24 = ZEXT1664((undefined1  [16])0x0);
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    auVar20 = ZEXT1664((undefined1  [16])0x0);
    auVar21 = ZEXT1664((undefined1  [16])0x0);
    auVar23 = ZEXT1664((undefined1  [16])0x0);
    auVar25 = ZEXT1664((undefined1  [16])0x0);
    auVar26 = ZEXT1664((undefined1  [16])0x0);
    auVar27 = ZEXT1664((undefined1  [16])0x0);
    auVar28 = ZEXT1664((undefined1  [16])0x0);
    auVar29 = ZEXT1664((undefined1  [16])0x0);
    auVar30 = ZEXT1664((undefined1  [16])0x0);
    auVar5 = vpxord_avx512vl(auVar5,auVar5);
    auVar31 = ZEXT1664(auVar5);
    auVar5 = vpxord_avx512vl(auVar32,auVar32);
    auVar33 = ZEXT1664(auVar5);
    auVar5 = vpxord_avx512vl(auVar34,auVar34);
    auVar35 = ZEXT1664(auVar5);
    auVar5 = vpxord_avx512vl(auVar36,auVar36);
    auVar37 = ZEXT1664(auVar5);
    auVar5 = vpxord_avx512vl(auVar38,auVar38);
    auVar39 = ZEXT1664(auVar5);
    auVar22 = ZEXT1664((undefined1  [16])0x0);
    uVar4 = 0;
    do {
      auVar6 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4));
      auVar7 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 + 0x20));
      uVar2 = uVar2 + 2;
      uVar4 = uVar4 + 0x40;
      auVar8 = vmovdqa64_avx512f(auVar6);
      auVar8 = vpermt2b_avx512_vbmi(auVar8,auVar15,auVar7);
      auVar6 = vpermt2b_avx512_vbmi(auVar7,auVar16,auVar6);
      auVar7 = vpsrld_avx512f(auVar8,1);
      auVar9 = vpsrld_avx512f(auVar8,2);
      auVar10 = vpsrld_avx512f(auVar8,3);
      auVar8 = vpandq_avx512f(auVar8,auVar17);
      auVar11 = vpsrld_avx512f(auVar6,1);
      auVar12 = vpsrld_avx512f(auVar6,2);
      auVar13 = vpsrld_avx512f(auVar6,3);
      auVar6 = vpandq_avx512f(auVar6,auVar17);
      auVar9 = vpandq_avx512f(auVar9,auVar17);
      auVar8 = vpsadbw_avx512bw(auVar8,auVar24);
      auVar10 = vpandq_avx512f(auVar10,auVar17);
      auVar11 = vpandq_avx512f(auVar11,auVar17);
      auVar6 = vpsadbw_avx512bw(auVar6,auVar24);
      auVar12 = vpandq_avx512f(auVar12,auVar17);
      auVar7 = vpandq_avx512f(auVar7,auVar17);
      auVar13 = vpandq_avx512f(auVar13,auVar17);
      auVar9 = vpsadbw_avx512bw(auVar9,auVar24);
      auVar10 = vpsadbw_avx512bw(auVar10,auVar24);
      auVar11 = vpsadbw_avx512bw(auVar11,auVar24);
      auVar12 = vpsadbw_avx512bw(auVar12,auVar24);
      auVar7 = vpsadbw_avx512bw(auVar7,auVar24);
      auVar13 = vpsadbw_avx512bw(auVar13,auVar24);
      auVar14 = vpandq_avx512f(auVar8,auVar18);
      auVar8 = vpsrld_avx512f(auVar8,4);
      auVar39 = vpaddq_avx512f(auVar39,auVar8);
      auVar8 = vpandq_avx512f(auVar9,auVar18);
      auVar9 = vpsrld_avx512f(auVar9,4);
      auVar22 = vpaddq_avx512f(auVar22,auVar14);
      auVar14 = vpandq_avx512f(auVar7,auVar18);
      auVar7 = vpsrld_avx512f(auVar7,4);
      auVar33 = vpaddq_avx512f(auVar33,auVar8);
      auVar8 = vpandq_avx512f(auVar10,auVar18);
      auVar31 = vpaddq_avx512f(auVar31,auVar9);
      auVar9 = vpsrld_avx512f(auVar10,4);
      auVar37 = vpaddq_avx512f(auVar37,auVar14);
      auVar35 = vpaddq_avx512f(auVar35,auVar7);
      auVar30 = vpaddq_avx512f(auVar30,auVar8);
      auVar7 = vpandq_avx512f(auVar6,auVar18);
      auVar6 = vpsrld_avx512f(auVar6,4);
      auVar29 = vpaddq_avx512f(auVar29,auVar9);
      auVar28 = vpaddq_avx512f(auVar28,auVar7);
      auVar27 = vpaddq_avx512f(auVar27,auVar6);
      auVar6 = vpandq_avx512f(auVar11,auVar18);
      auVar7 = vpsrld_avx512f(auVar11,4);
      auVar26 = vpaddq_avx512f(auVar26,auVar6);
      auVar25 = vpaddq_avx512f(auVar25,auVar7);
      auVar6 = vpandq_avx512f(auVar12,auVar18);
      auVar7 = vpsrld_avx512f(auVar12,4);
      auVar23 = vpaddq_avx512f(auVar23,auVar6);
      auVar21 = vpaddq_avx512f(auVar21,auVar7);
      auVar6 = vpandq_avx512f(auVar13,auVar18);
      auVar7 = vpsrld_avx512f(auVar13,4);
      auVar20 = vpaddq_avx512f(auVar20,auVar6);
      auVar19 = vpaddq_avx512f(auVar19,auVar7);
    } while (uVar2 <= len >> 5);
    local_380 = vmovdqa64_avx512f(auVar39);
    local_440 = vmovdqa64_avx512f(auVar37);
    local_340 = vmovdqa64_avx512f(auVar35);
    local_400 = vmovdqa64_avx512f(auVar33);
    local_300 = vmovdqa64_avx512f(auVar31);
    local_3c0 = vmovdqa64_avx512f(auVar30);
    local_2c0 = vmovdqa64_avx512f(auVar29);
    local_280 = vmovdqa64_avx512f(auVar28);
    local_180 = vmovdqa64_avx512f(auVar27);
    local_240 = vmovdqa64_avx512f(auVar26);
    local_140 = vmovdqa64_avx512f(auVar25);
    local_200 = vmovdqa64_avx512f(auVar23);
    local_100 = vmovdqa64_avx512f(auVar21);
    local_1c0 = vmovdqa64_avx512f(auVar20);
    local_c0 = vmovdqa64_avx512f(auVar19);
  }
  lVar3 = 0;
  local_480 = vmovdqa64_avx512f(auVar22);
  do {
    auVar5 = vpaddq_avx(pauVar1[3],pauVar1[2]);
    auVar32 = vpaddq_avx(pauVar1[1],*pauVar1);
    pauVar1 = pauVar1 + 4;
    auVar34 = vpshufd_avx(auVar5,0xee);
    auVar36 = vpshufd_avx(auVar32,0xee);
    auVar32 = vpaddq_avx(auVar32,auVar36);
    auVar5 = vpaddq_avx(auVar5,auVar34);
    flags[lVar3] = auVar5._0_4_ + auVar32._0_4_;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  if (uVar4 < len) {
    auVar15 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar16 = vpmovsxbd_avx512f(_DAT_00115080);
    auVar17 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      uVar4 = uVar4 + 1;
      auVar18 = vpbroadcastd_avx512f();
      auVar18 = vpsrlvd_avx512f(auVar18,auVar16);
      auVar18 = vpandd_avx512f(auVar18,auVar17);
      auVar15 = vpaddd_avx512f(auVar18,auVar15);
    } while (len != uVar4);
    auVar15 = vmovdqu64_avx512f(auVar15);
    *(undefined1 (*) [64])flags = auVar15;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512_mula2(const uint16_t* data, uint32_t len, uint32_t* flags) {
    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

    __m512i sum[16];
    for (int i=0; i < 16; ++i)
        sum[i] = _mm512_setzero_si512();

    size_t i = 0;
    for (/**/; i + 2 <= n_cycles; i += 2) {
        __m512i v0 = _mm512_loadu_si512(data_vectors + i);
        __m512i v1 = _mm512_loadu_si512(data_vectors + i + 1);

        __m512i input0 = _mm512_or_si512(_mm512_and_si512(v0, _mm512_set1_epi16(0x00FF)), _mm512_slli_epi16(v1, 8));
        __m512i input1 = _mm512_or_si512(_mm512_and_si512(v0, _mm512_set1_epi16(0xFF00)), _mm512_srli_epi16(v1, 8));
        
        const __m512i bits_04 = _mm512_and_si512(input0, _mm512_set1_epi16(0x1111));
        const __m512i bits_15 = _mm512_and_si512(_mm512_srli_epi32(input0, 1), _mm512_set1_epi16(0x1111)); // 00010001 00010001
        const __m512i bits_26 = _mm512_and_si512(_mm512_srli_epi32(input0, 2), _mm512_set1_epi16(0x1111));
        const __m512i bits_37 = _mm512_and_si512(_mm512_srli_epi32(input0, 3), _mm512_set1_epi16(0x1111));

        const __m512i bits_8c = _mm512_and_si512(input1, _mm512_set1_epi16(0x1111));
        const __m512i bits_9d = _mm512_and_si512(_mm512_srli_epi32(input1, 1), _mm512_set1_epi16(0x1111));
        const __m512i bits_ae = _mm512_and_si512(_mm512_srli_epi32(input1, 2), _mm512_set1_epi16(0x1111));
        const __m512i bits_bf = _mm512_and_si512(_mm512_srli_epi32(input1, 3), _mm512_set1_epi16(0x1111));

        const __m512i sum_04 = _mm512_sad_epu8(bits_04, _mm512_setzero_si512());
        const __m512i sum_15 = _mm512_sad_epu8(bits_15, _mm512_setzero_si512());
        const __m512i sum_26 = _mm512_sad_epu8(bits_26, _mm512_setzero_si512());
        const __m512i sum_37 = _mm512_sad_epu8(bits_37, _mm512_setzero_si512());

        const __m512i sum_8c = _mm512_sad_epu8(bits_8c, _mm512_setzero_si512());
        const __m512i sum_9d = _mm512_sad_epu8(bits_9d, _mm512_setzero_si512());
        const __m512i sum_ae = _mm512_sad_epu8(bits_ae, _mm512_setzero_si512());
        const __m512i sum_bf = _mm512_sad_epu8(bits_bf, _mm512_setzero_si512());

        sum[0x0] = _mm512_add_epi64(sum[0x0], _mm512_and_si512 (sum_04, _mm512_set1_epi64(0xF))); // 00001111
        sum[0x4] = _mm512_add_epi64(sum[0x4], _mm512_srli_epi32(sum_04, 4));
        sum[0x1] = _mm512_add_epi64(sum[0x1], _mm512_and_si512 (sum_15, _mm512_set1_epi64(0xF)));
        sum[0x5] = _mm512_add_epi64(sum[0x5], _mm512_srli_epi32(sum_15, 4));
        sum[0x2] = _mm512_add_epi64(sum[0x2], _mm512_and_si512 (sum_26, _mm512_set1_epi64(0xF)));
        sum[0x6] = _mm512_add_epi64(sum[0x6], _mm512_srli_epi32(sum_26, 4));
        sum[0x3] = _mm512_add_epi64(sum[0x3], _mm512_and_si512 (sum_37, _mm512_set1_epi64(0xF)));
        sum[0x7] = _mm512_add_epi64(sum[0x7], _mm512_srli_epi32(sum_37, 4));
        sum[0x8] = _mm512_add_epi64(sum[0x8], _mm512_and_si512 (sum_8c, _mm512_set1_epi64(0xF)));
        sum[0xc] = _mm512_add_epi64(sum[0xc], _mm512_srli_epi32(sum_8c, 4));
        sum[0x9] = _mm512_add_epi64(sum[0x9], _mm512_and_si512 (sum_9d, _mm512_set1_epi64(0xF)));
        sum[0xd] = _mm512_add_epi64(sum[0xd], _mm512_srli_epi32(sum_9d, 4));
        sum[0xa] = _mm512_add_epi64(sum[0xa], _mm512_and_si512 (sum_ae, _mm512_set1_epi64(0xF)));
        sum[0xe] = _mm512_add_epi64(sum[0xe], _mm512_srli_epi32(sum_ae, 4));
        sum[0xb] = _mm512_add_epi64(sum[0xb], _mm512_and_si512 (sum_bf, _mm512_set1_epi64(0xF)));
        sum[0xf] = _mm512_add_epi64(sum[0xf], _mm512_srli_epi32(sum_bf, 4));
    }

    for (int j = 0; j < 16; ++j) {
        const __m128i dq0 = _mm512_extracti32x4_epi32(sum[j], 0);
        const __m128i dq1 = _mm512_extracti32x4_epi32(sum[j], 1);
        const __m128i dq2 = _mm512_extracti32x4_epi32(sum[j], 2);
        const __m128i dq3 = _mm512_extracti32x4_epi32(sum[j], 3);
        flags[j] = _mm_extract_epi64(dq0, 0)
                    + _mm_extract_epi64(dq0, 1)
                    + _mm_extract_epi64(dq1, 0)
                    + _mm_extract_epi64(dq1, 1)
                    + _mm_extract_epi64(dq2, 0)
                    + _mm_extract_epi64(dq2, 1)
                    + _mm_extract_epi64(dq3, 0)
                    + _mm_extract_epi64(dq3, 1);
    }

    i *= 32;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((data[i] & (1 << j)) >> j);
        }
    }

    return 0;
}